

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O2

void __thiscall
Js::JavascriptStackWalker::GetThis(JavascriptStackWalker *this,Var *pVarThis,int moduleId)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  Var pvVar4;
  undefined4 *puVar5;
  CallInfo CVar6;
  
  if ((this->field_0x50 & 1) == 0) {
    CVar6 = GetCallInfo(this,true);
    if (((ulong)CVar6 & 0xffffff) == 0) goto LAB_009d1df5;
    pvVar4 = GetThisFromFrame(this);
  }
  else {
    sVar3 = InlinedFrameWalker::GetArgc(&this->inlinedFrameWalker);
    if (sVar3 != 0) {
      pvVar4 = InlinedFrameWalker::GetThisObject(&this->inlinedFrameWalker);
      *pVarThis = pvVar4;
      if (pvVar4 != (Var)0x0) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0xcb,"(*pVarThis)","*pVarThis");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
      pvVar4 = *pVarThis;
      goto LAB_009d1e0e;
    }
LAB_009d1df5:
    pvVar4 = JavascriptOperators::OP_GetThis
                       ((((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
                        super_JavascriptLibraryBase).undefinedValue.ptr,moduleId,
                        &this->scriptContext->super_ScriptContextInfo);
  }
  *pVarThis = pvVar4;
LAB_009d1e0e:
  if (pvVar4 == (Var)0x0) {
    *pVarThis = (((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
                super_JavascriptLibraryBase).nullValue.ptr;
  }
  return;
}

Assistant:

void JavascriptStackWalker::GetThis(Var* pVarThis, int moduleId) const
    {
#if ENABLE_NATIVE_CODEGEN
        if (inlinedFramesBeingWalked)
        {
            if (inlinedFrameWalker.GetArgc() == 0)
            {
                *pVarThis = JavascriptOperators::OP_GetThis(this->scriptContext->GetLibrary()->GetUndefined(), moduleId, scriptContext);
            }
            else
            {
                *pVarThis = inlinedFrameWalker.GetThisObject();
                Assert(*pVarThis);
            }
        }
        else
#endif
        {
            const CallInfo callInfo = this->GetCallInfo();
            if (callInfo.Count == 0)
            {
                *pVarThis = JavascriptOperators::OP_GetThis(scriptContext->GetLibrary()->GetUndefined(), moduleId, scriptContext);
            }
            else
            {
                *pVarThis = this->GetThisFromFrame();
            }
        }

        if (*pVarThis == nullptr)
        {
            *pVarThis = this->scriptContext->GetLibrary()->GetNull();
        }
    }